

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_OptimizedTree.cpp
# Opt level: O0

void Opcode::AABBNoLeafTree::Walk(bool(*)(void_const*,void*),void*)::
     AABBNoLeafNode_const__bool_____void_const__void___void__
               (AABBNoLeafNode *current_node,GenericWalkingCallback callback,void *user_data)

{
  bool bVar1;
  void *user_data_local;
  GenericWalkingCallback callback_local;
  AABBNoLeafNode *current_node_local;
  
  if ((current_node != (AABBNoLeafNode *)0x0) &&
     (bVar1 = (*callback)(current_node,user_data), bVar1)) {
    if ((current_node->mPosData & 1) == 0) {
      AABBNoLeafNode_const__bool_____void_const__void___void__
                ((AABBNoLeafNode *)current_node->mPosData,callback,user_data);
    }
    if ((current_node->mNegData & 1) == 0) {
      AABBNoLeafNode_const__bool_____void_const__void___void__
                ((AABBNoLeafNode *)current_node->mNegData,callback,user_data);
    }
  }
  return;
}

Assistant:

static void _Walk(const AABBNoLeafNode* current_node, GenericWalkingCallback callback, void* user_data)
		{
			if(!current_node || !(callback)(current_node, user_data))	return;

			if(!current_node->HasPosLeaf())	_Walk(current_node->GetPos(), callback, user_data);
			if(!current_node->HasNegLeaf())	_Walk(current_node->GetNeg(), callback, user_data);
		}